

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
  *in_stack_ffffffffffffffe0;
  
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  TypeDefinedMapFieldBase(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__DynamicMapField_008d6428;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Map
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)0x4162a3);
  in_RDI[0xc] = in_RSI;
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry)
    : default_entry_(default_entry) {}